

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O0

void __thiscall GMESong::~GMESong(GMESong *this)

{
  Music_Emu *in_stack_ffffffffffffffe0;
  GMESong *this_local;
  
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__GMESong_009f0388;
  (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[7])();
  if ((this->super_StreamSong).m_Stream != (SoundStream *)0x0) {
    in_stack_ffffffffffffffe0 = (Music_Emu *)(this->super_StreamSong).m_Stream;
    if (in_stack_ffffffffffffffe0 != (Music_Emu *)0x0) {
      (*(in_stack_ffffffffffffffe0->super_Gme_File)._vptr_Gme_File[1])();
    }
    (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  }
  if (this->TrackInfo != (gme_info_t *)0x0) {
    gme_free_info((gme_info_t *)in_stack_ffffffffffffffe0);
  }
  if (this->Emu != (Music_Emu *)0x0) {
    gme_delete(in_stack_ffffffffffffffe0);
  }
  FCriticalSection::~FCriticalSection(&this->CritSec);
  StreamSong::~StreamSong(&this->super_StreamSong);
  return;
}

Assistant:

GMESong::~GMESong()
{
	Stop();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
	if (TrackInfo != NULL)
	{
		gme_free_info(TrackInfo);
	}
	if (Emu != NULL)
	{
		gme_delete(Emu);
	}
}